

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_manager.cpp
# Opt level: O0

void __thiscall miniros::PollManager::threadFunc(PollManager *this)

{
  bool bVar1;
  PollWatcher *pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool enabled;
  int updatePeriodMS;
  int in_stack_0000009c;
  iterator_t it;
  scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_> lock;
  mutex_type *in_stack_ffffffffffffff48;
  Level level;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Iterator<miniros::PollManager::PollWatcher> *in_stack_ffffffffffffff58;
  Iterator<miniros::PollManager::PollWatcher> in_stack_ffffffffffffff60;
  Level in_stack_ffffffffffffff74;
  iterator_t in_stack_ffffffffffffff78;
  LogLocation *in_stack_ffffffffffffff80;
  iterator_t in_stack_ffffffffffffff88;
  allocator<char> local_61;
  string local_60 [36];
  undefined4 local_3c;
  PollWatcher *local_38;
  Iterator<miniros::PollManager::PollWatcher> local_30 [3];
  Iterator<miniros::PollManager::PollWatcher> local_18 [3];
  
  setThreadName((char *)0x482c68);
  disableAllSignalsInThisThread();
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff58),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff80 = (LogLocation *)((long)&in_RDI[7].field_2 + 8);
    std::scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_>::scoped_lock
              ((scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff88 =
         observer::Target<miniros::PollManager::PollWatcher>::begin(in_stack_ffffffffffffff48);
    local_18[0].m_obj = (PollWatcher *)in_stack_ffffffffffffff88;
    while( true ) {
      in_stack_ffffffffffffff78 =
           observer::Target<miniros::PollManager::PollWatcher>::end(in_stack_ffffffffffffff48);
      local_30[0].m_obj = (PollWatcher *)in_stack_ffffffffffffff78;
      bVar1 = observer::operator!=(local_18,local_30);
      in_stack_ffffffffffffff74 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff74);
      if (!bVar1) break;
      bVar1 = observer::Iterator::operator_cast_to_bool((Iterator *)local_18);
      in_stack_ffffffffffffff74 = (Level)CONCAT12(bVar1,(short)in_stack_ffffffffffffff74);
      if (bVar1) {
        pPVar2 = observer::Iterator<miniros::PollManager::PollWatcher>::operator->(local_18);
        (*(pPVar2->super_Connection)._vptr_Connection[2])();
      }
      in_stack_ffffffffffffff60 =
           observer::Iterator<miniros::PollManager::PollWatcher>::operator++
                     (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      local_38 = (PollWatcher *)in_stack_ffffffffffffff60;
    }
    std::scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_>::~scoped_lock
              ((scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_> *)
               0x482db2);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff58);
    if (bVar1) break;
    checkForShutdown();
    local_3c = 100;
    PollSet::update((PollSet *)it.m_obj,in_stack_0000009c);
  }
  level = (Level)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((threadFunc::loc.initialized_ ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)in_stack_ffffffffffffff88.m_obj,
               (allocator<char> *)in_stack_ffffffffffffff80);
    console::initializeLogLocation
              (in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78.m_obj,
               in_stack_ffffffffffffff74);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  if (threadFunc::loc.level_ != Info) {
    console::setLogLocationLevel
              ((LogLocation *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),level);
    console::checkLogLocationEnabled((LogLocation *)in_stack_ffffffffffffff60.m_obj);
  }
  if ((threadFunc::loc.logger_enabled_ & 1U) != 0) {
    console::print((FilterBase *)0x0,threadFunc::loc.logger_,(Level)(ulong)threadFunc::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_manager.cpp"
                   ,0x72,"void miniros::PollManager::threadFunc()","PollManager thread exit");
  }
  return;
}

Assistant:

void PollManager::threadFunc()
{
  setThreadName("PollManager");
  disableAllSignalsInThisThread();

  while (!shutting_down_)
  {
    {
      std::scoped_lock<PollWatchers> lock(poll_watchers_);
      auto it = poll_watchers_.begin();
      for (; it != poll_watchers_.end(); it++)
      {
        if (it)
          it->onPollEvents();
      }
    }

    if (shutting_down_)
    {
      break;
    }

    // While it breaks abstraction, it reduces number of mutexes and threading challenges.
    checkForShutdown();

    constexpr int updatePeriodMS = 100;

    poll_set_.update(updatePeriodMS);
  }
  MINIROS_INFO("PollManager thread exit");
}